

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void bk_lib::detail::fill<Clasp::VarInfo>(VarInfo *first,VarInfo *last,VarInfo *x)

{
  uint8 uVar1;
  
  switch((int)last - (int)first & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      uVar1 = x->rep;
      first->rep = uVar1;
      first = first + 1;
LAB_001649cd:
      first->rep = uVar1;
      first = first + 1;
switchD_001649af_caseD_6:
      uVar1 = x->rep;
      first->rep = uVar1;
      first = first + 1;
LAB_001649d9:
      first->rep = uVar1;
      first = first + 1;
switchD_001649af_caseD_4:
      uVar1 = x->rep;
      first->rep = uVar1;
      first = first + 1;
LAB_001649e5:
      first->rep = uVar1;
      first = first + 1;
switchD_001649af_caseD_2:
      uVar1 = x->rep;
      first->rep = uVar1;
      first = first + 1;
LAB_001649f1:
      first->rep = uVar1;
    }
    break;
  case 1:
    uVar1 = x->rep;
    goto LAB_001649f1;
  case 2:
    goto switchD_001649af_caseD_2;
  case 3:
    uVar1 = x->rep;
    goto LAB_001649e5;
  case 4:
    goto switchD_001649af_caseD_4;
  case 5:
    uVar1 = x->rep;
    goto LAB_001649d9;
  case 6:
    goto switchD_001649af_caseD_6;
  case 7:
    uVar1 = x->rep;
    goto LAB_001649cd;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}